

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

bool P_IsBuildMap(MapData *map)

{
  DWORD DVar1;
  uint uVar2;
  int *buffer;
  int numwalls;
  int numsec;
  BYTE *data;
  DWORD len;
  MapData *map_local;
  
  DVar1 = MapData::Size(map,0);
  if (DVar1 < 4) {
    map_local._7_1_ = false;
  }
  else {
    buffer = (int *)operator_new__((ulong)DVar1);
    MapData::Seek(map,0);
    MapData::Read(map,0,buffer,-1);
    if (*buffer == 0x1a4d4c42) {
      if (buffer != (int *)0x0) {
        operator_delete__(buffer);
      }
      map_local._7_1_ = true;
    }
    else {
      uVar2 = (uint)*(ushort *)(buffer + 5);
      if ((((DVar1 < uVar2 * 0x28 + 0x1a) ||
           (DVar1 < uVar2 * 0x28 + 0x18 +
                    (uint)*(ushort *)((long)buffer + (long)(int)uVar2 * 0x28 + 0x16) * 0x20)) ||
          (*buffer != 7)) || (0x7ff < *(ushort *)(buffer + 4))) {
        if (buffer != (int *)0x0) {
          operator_delete__(buffer);
        }
        map_local._7_1_ = false;
      }
      else {
        if (buffer != (int *)0x0) {
          operator_delete__(buffer);
        }
        map_local._7_1_ = true;
      }
    }
  }
  return map_local._7_1_;
}

Assistant:

bool P_IsBuildMap(MapData *map)
{
	DWORD len = map->Size(ML_LABEL);
	if (len < 4)
	{
		return false;
	}
	BYTE *data = new BYTE[len];

	map->Seek(ML_LABEL);
	map->Read(ML_LABEL, data);

	// Check for a Blood map.
	if (*(DWORD *)data == MAKE_ID('B','L','M','\x1a'))
	{
		delete[] data;
		return true;
	}

	const int numsec = LittleShort(*(WORD *)(data + 20));
	int numwalls;

	if (len < 26 + numsec*sizeof(sectortype) ||
		(numwalls = LittleShort(*(WORD *)(data + 22 + numsec*sizeof(sectortype))),
			len < 24 + numsec*sizeof(sectortype) + numwalls*sizeof(walltype)) ||
		LittleLong(*(DWORD *)data) != 7 ||
		LittleShort(*(WORD *)(data + 16)) >= 2048)
	{ // Can't possibly be a version 7 BUILD map
		delete[] data;
		return false;
	}
	delete[] data;
	return true;
}